

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O0

_Bool eddsa_verify(ssh_key *key,ptrlen sig,ptrlen data)

{
  ecsign_extra *extra_00;
  _Bool _Var1;
  uint uVar2;
  eddsa_key *ek_00;
  EdwardsPoint *P;
  mp_int *n;
  mp_int *n_00;
  EdwardsPoint *P_00;
  EdwardsPoint *Q;
  EdwardsPoint *Q_00;
  ptrlen pVar3;
  ptrlen bytes;
  uint valid;
  EdwardsPoint *rhs;
  EdwardsPoint *hpk;
  EdwardsPoint *lhs;
  mp_int *H;
  mp_int *s;
  EdwardsPoint *r;
  ptrlen sstr;
  ptrlen rstr;
  ptrlen sigstr;
  undefined1 local_78 [8];
  BinarySource src [1];
  ecsign_extra *extra;
  eddsa_key *ek;
  ssh_key *key_local;
  ptrlen data_local;
  ptrlen sig_local;
  
  ek_00 = (eddsa_key *)(key + -3);
  extra_00 = (ecsign_extra *)key->vt->extra;
  BinarySource_INIT__((BinarySource *)local_78,sig);
  pVar3 = BinarySource_get_string((BinarySource *)src[0]._24_8_);
  _Var1 = ptrlen_eq_string(pVar3,key->vt->ssh_id);
  if (_Var1) {
    pVar3 = BinarySource_get_string((BinarySource *)src[0]._24_8_);
    if (*(int *)(src[0]._24_8_ + 0x18) == 0) {
      BinarySource_INIT__((BinarySource *)local_78,pVar3);
      pVar3 = BinarySource_get_data((BinarySource *)src[0]._24_8_,ek_00->curve->fieldBytes);
      bytes = BinarySource_get_data((BinarySource *)src[0]._24_8_,ek_00->curve->fieldBytes);
      if ((*(int *)(src[0]._24_8_ + 0x18) == 0) &&
         (*(long *)(src[0]._24_8_ + 0x10) == *(long *)(src[0]._24_8_ + 8))) {
        P = eddsa_decode(pVar3,ek_00->curve);
        if (P == (EdwardsPoint *)0x0) {
          sig_local.len._7_1_ = false;
        }
        else {
          n = mp_from_bytes_le(bytes);
          n_00 = eddsa_signing_exponent_from_data(ek_00,extra_00,pVar3,data);
          P_00 = ecc_edwards_multiply((ek_00->curve->field_6).e.G,n);
          mp_free(n);
          Q = ecc_edwards_multiply((EdwardsPoint *)key[-2].vt,n_00);
          mp_free(n_00);
          Q_00 = ecc_edwards_add(P,Q);
          ecc_edwards_point_free(Q);
          uVar2 = ecc_edwards_eq(P_00,Q_00);
          ecc_edwards_point_free(P_00);
          ecc_edwards_point_free(Q_00);
          ecc_edwards_point_free(P);
          sig_local.len._7_1_ = uVar2 != 0;
        }
      }
      else {
        sig_local.len._7_1_ = false;
      }
    }
    else {
      sig_local.len._7_1_ = false;
    }
  }
  else {
    sig_local.len._7_1_ = false;
  }
  return sig_local.len._7_1_;
}

Assistant:

static bool eddsa_verify(ssh_key *key, ptrlen sig, ptrlen data)
{
    struct eddsa_key *ek = container_of(key, struct eddsa_key, sshk);
    const struct ecsign_extra *extra =
        (const struct ecsign_extra *)ek->sshk.vt->extra;

    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, sig);

    /* Check the signature starts with the algorithm name */
    if (!ptrlen_eq_string(get_string(src), ek->sshk.vt->ssh_id))
        return false;

    /* Now expect a single string which is the concatenation of an
     * encoded curve point r and an integer s. */
    ptrlen sigstr = get_string(src);
    if (get_err(src))
        return false;
    BinarySource_BARE_INIT_PL(src, sigstr);
    ptrlen rstr = get_data(src, ek->curve->fieldBytes);
    ptrlen sstr = get_data(src, ek->curve->fieldBytes);
    if (get_err(src) || get_avail(src))
        return false;

    EdwardsPoint *r = eddsa_decode(rstr, ek->curve);
    if (!r)
        return false;
    mp_int *s = mp_from_bytes_le(sstr);

    mp_int *H = eddsa_signing_exponent_from_data(ek, extra, rstr, data);

    /* Verify that s*G == r + H*publicKey */
    EdwardsPoint *lhs = ecc_edwards_multiply(ek->curve->e.G, s);
    mp_free(s);
    EdwardsPoint *hpk = ecc_edwards_multiply(ek->publicKey, H);
    mp_free(H);
    EdwardsPoint *rhs = ecc_edwards_add(r, hpk);
    ecc_edwards_point_free(hpk);
    unsigned valid = ecc_edwards_eq(lhs, rhs);
    ecc_edwards_point_free(lhs);
    ecc_edwards_point_free(rhs);
    ecc_edwards_point_free(r);

    return valid;
}